

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentBG.cpp
# Opt level: O0

Index __thiscall AgentBG::GetMaximizingActionIndex(AgentBG *this,JointBeliefInterface *jb)

{
  BGPolicyIndex *betaMaxI;
  BGPolicyIndex *pBVar1;
  AgentDecPOMDPDiscrete *in_RDI;
  Index a;
  BGPolicyIndex bI;
  Index ja;
  double q;
  double v;
  Index t;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar2;
  QAV<PerseusBGPlanner> *in_stack_ffffffffffffffd0;
  Index local_24;
  double local_20;
  double local_18;
  
  local_18 = -1.79769313486232e+308;
  local_24 = 0x7fffffff;
  uVar2 = 0;
  while( true ) {
    betaMaxI = (BGPolicyIndex *)(ulong)uVar2;
    AgentDecPOMDPDiscrete::GetPU(in_RDI);
    pBVar1 = (BGPolicyIndex *)
             PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x8fae60);
    if (betaMaxI == pBVar1) break;
    t = (Index)((ulong)in_RDI >> 0x20);
    if (in_RDI[1].super_SimulationAgent._vptr_SimulationAgent == (_func_int **)0x0) {
      local_20 = QAV<PerseusBGNSPlanner>::GetQ
                           ((QAV<PerseusBGNSPlanner> *)in_stack_ffffffffffffffd0,
                            (JointBeliefInterface *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),t,
                            (Index)in_RDI,betaMaxI);
    }
    else {
      local_20 = QAV<PerseusBGPlanner>::GetQ
                           (in_stack_ffffffffffffffd0,
                            (JointBeliefInterface *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),t,
                            betaMaxI);
    }
    if (local_18 < local_20) {
      local_18 = local_20;
      local_24 = uVar2;
    }
    uVar2 = uVar2 + 1;
  }
  return local_24;
}

Assistant:

Index AgentBG::GetMaximizingActionIndex(const JointBeliefInterface &jb) const
{
    double v=-DBL_MAX,q;
    Index ja=INT_MAX;
    AlphaVector::BGPolicyIndex bI;

    for(Index a=0;a!=GetPU()->GetNrJointActions();++a)
    {
        if(_m_QBGstationary)
            q=_m_QBGstationary->GetQ(jb,a,bI);
        else
            q=_m_QBGnonStationary->GetQ(jb,_m_t,a,bI);
        
        if(q>v)
        {
            v=q;
            ja=a;
        }
    }

    return(ja);
}